

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

void __thiscall
webrtc::Matrix<std::complex<float>_>::Matrix
          (Matrix<std::complex<float>_> *this,size_t num_rows,size_t num_columns)

{
  size_t num_columns_local;
  size_t num_rows_local;
  Matrix<std::complex<float>_> *this_local;
  
  this->_vptr_Matrix = (_func_int **)&PTR__Matrix_002fb410;
  this->num_rows_ = num_rows;
  this->num_columns_ = num_columns;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector(&this->data_);
  std::vector<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>::vector
            (&this->elements_);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            (&this->scratch_data_);
  std::vector<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>::vector
            (&this->scratch_elements_);
  Resize(this);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::resize
            (&this->scratch_data_,this->num_rows_ * this->num_columns_);
  std::vector<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>::resize
            (&this->scratch_elements_,this->num_rows_);
  return;
}

Assistant:

Matrix(size_t num_rows, size_t num_columns)
      : num_rows_(num_rows), num_columns_(num_columns) {
    Resize();
    scratch_data_.resize(num_rows_ * num_columns_);
    scratch_elements_.resize(num_rows_);
  }